

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

float deqp::gles3::Functional::MatrixCaseUtils::determinant<4>(Matrix<float,_4,_4> *mat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *pfVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Matrix<float,_3,_3> local_148;
  Matrix<float,_3,_3> local_124;
  Matrix<float,_3,_3> local_100;
  Matrix<float,_3,_3> local_cc;
  float local_a8;
  float local_a4;
  float minorMatrices [4] [9];
  Matrix<float,_4,_4> *mat_local;
  
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,1,1);
  local_a8 = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,2,1);
  local_a4 = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,3,1);
  minorMatrices[0][0] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,1,2);
  minorMatrices[0][1] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,2,2);
  minorMatrices[0][2] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,3,2);
  minorMatrices[0][3] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,1,3);
  minorMatrices[0][4] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,2,3);
  minorMatrices[0][5] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,3,3);
  minorMatrices[0][6] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,1,0);
  minorMatrices[0][7] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,2,0);
  minorMatrices[0][8] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,3,0);
  minorMatrices[1][0] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,1,2);
  minorMatrices[1][1] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,2,2);
  minorMatrices[1][2] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,3,2);
  minorMatrices[1][3] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,1,3);
  minorMatrices[1][4] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,2,3);
  minorMatrices[1][5] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,3,3);
  minorMatrices[1][6] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,1,0);
  minorMatrices[1][7] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,2,0);
  minorMatrices[1][8] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,3,0);
  minorMatrices[2][0] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,1,1);
  minorMatrices[2][1] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,2,1);
  minorMatrices[2][2] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,3,1);
  minorMatrices[2][3] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,1,3);
  minorMatrices[2][4] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,2,3);
  minorMatrices[2][5] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,3,3);
  minorMatrices[2][6] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,1,0);
  minorMatrices[2][7] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,2,0);
  minorMatrices[2][8] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,3,0);
  minorMatrices[3][0] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,1,1);
  minorMatrices[3][1] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,2,1);
  minorMatrices[3][2] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,3,1);
  minorMatrices[3][3] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,1,2);
  minorMatrices[3][4] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,2,2);
  minorMatrices[3][5] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,3,2);
  minorMatrices[3][6] = *pfVar5;
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,0,0);
  fVar1 = *pfVar5;
  tcu::Matrix<float,_3,_3>::Matrix(&local_cc,&local_a8);
  fVar6 = determinant<3>(&local_cc);
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,0,1);
  fVar2 = *pfVar5;
  tcu::Matrix<float,_3,_3>::Matrix(&local_100,minorMatrices[0] + 7);
  fVar7 = determinant<3>(&local_100);
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,0,2);
  fVar3 = *pfVar5;
  tcu::Matrix<float,_3,_3>::Matrix(&local_124,minorMatrices[1] + 7);
  fVar8 = determinant<3>(&local_124);
  pfVar5 = tcu::Matrix<float,_4,_4>::operator()(mat,0,3);
  fVar4 = *pfVar5;
  tcu::Matrix<float,_3,_3>::Matrix(&local_148,minorMatrices[2] + 7);
  fVar9 = determinant<3>(&local_148);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_148);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_124);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_100);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_cc);
  return -fVar4 * fVar9 + fVar3 * fVar8 + (fVar1 * fVar6 - fVar2 * fVar7);
}

Assistant:

float determinant<4> (const tcu::Matrix<float, 4, 4>& mat)
{
	const float minorMatrices[4][3*3] =
	{
		{
			mat(1,1),	mat(2,1),	mat(3,1),
			mat(1,2),	mat(2,2),	mat(3,2),
			mat(1,3),	mat(2,3),	mat(3,3),
		},
		{
			mat(1,0),	mat(2,0),	mat(3,0),
			mat(1,2),	mat(2,2),	mat(3,2),
			mat(1,3),	mat(2,3),	mat(3,3),
		},
		{
			mat(1,0),	mat(2,0),	mat(3,0),
			mat(1,1),	mat(2,1),	mat(3,1),
			mat(1,3),	mat(2,3),	mat(3,3),
		},
		{
			mat(1,0),	mat(2,0),	mat(3,0),
			mat(1,1),	mat(2,1),	mat(3,1),
			mat(1,2),	mat(2,2),	mat(3,2),
		}
	};

	return	+ mat(0,0) * determinant(tcu::Mat3(minorMatrices[0]))
			- mat(0,1) * determinant(tcu::Mat3(minorMatrices[1]))
			+ mat(0,2) * determinant(tcu::Mat3(minorMatrices[2]))
			- mat(0,3) * determinant(tcu::Mat3(minorMatrices[3]));
}